

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

Address CreateAddress(string *ip,int port)

{
  Address AVar1;
  sockaddr_in address;
  
  address.sin_family = 2;
  inet_pton(2,(ip->_M_dataplus)._M_p,&address.sin_addr);
  AVar1.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  AVar1.sin_family = address.sin_family;
  AVar1.sin_addr.s_addr = address.sin_addr.s_addr;
  AVar1.sin_zero[0] = address.sin_zero[0];
  AVar1.sin_zero[1] = address.sin_zero[1];
  AVar1.sin_zero[2] = address.sin_zero[2];
  AVar1.sin_zero[3] = address.sin_zero[3];
  AVar1.sin_zero[4] = address.sin_zero[4];
  AVar1.sin_zero[5] = address.sin_zero[5];
  AVar1.sin_zero[6] = address.sin_zero[6];
  AVar1.sin_zero[7] = address.sin_zero[7];
  return AVar1;
}

Assistant:

Address CreateAddress(std::string ip, int port){
    struct sockaddr_in address;

    address.sin_family = AF_INET;
    //address.sin_addr.s_addr = inet_addr(ip.c_str());
    inet_pton(AF_INET, ip.c_str(), &address.sin_addr);
    address.sin_port = htons(port);

    return address;
}